

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O2

LY_ERR lyd_diff_merge_tree(lyd_node **diff_first,lyd_node *diff_parent,lyd_node *src_sibling,
                          lyd_diff_cb diff_cb,void *cb_data,uint16_t options)

{
  LY_ERR LVar1;
  ly_ht *dup_inst;
  ly_ht *local_18;
  
  local_18 = (ly_ht *)0x0;
  if (src_sibling == (lyd_node *)0x0) {
    LVar1 = LY_SUCCESS;
  }
  else {
    LVar1 = lyd_diff_merge_r(src_sibling,diff_parent,diff_cb,cb_data,&local_18,options,diff_first);
    lyd_dup_inst_free(local_18);
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_diff_merge_tree(struct lyd_node **diff_first, struct lyd_node *diff_parent, const struct lyd_node *src_sibling,
        lyd_diff_cb diff_cb, void *cb_data, uint16_t options)
{
    LY_ERR ret;
    struct ly_ht *dup_inst = NULL;

    if (!src_sibling) {
        return LY_SUCCESS;
    }

    ret = lyd_diff_merge_r(src_sibling, diff_parent, diff_cb, cb_data, &dup_inst, options, diff_first);
    lyd_dup_inst_free(dup_inst);
    return ret;
}